

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

TValue * luaH_newkey(lua_State *L,Table *t,TValue *key)

{
  int iVar1;
  Value VVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  Node *pNVar8;
  Node *pNVar9;
  Node *pNVar10;
  int lg;
  long lVar11;
  uint nasize;
  int iVar12;
  uint uVar13;
  uint uVar14;
  char *fmt;
  int iVar15;
  long lVar16;
  int *piVar17;
  int ause;
  int iVar18;
  Node *pNVar19;
  TValue *io2;
  int iVar20;
  int local_b8 [34];
  
  if (key->tt_ == 3) {
    if (NAN((key->value_).n)) {
      fmt = "table index is NaN";
      goto LAB_001106da;
    }
  }
  else if (key->tt_ == 0) {
    fmt = "table index is nil";
LAB_001106da:
    luaG_runerror(L,fmt);
  }
  pNVar8 = mainposition(t,key);
  if ((pNVar8 == &dummynode_) || ((pNVar8->i_val).tt_ != 0)) {
    pNVar9 = t->lastfree;
    do {
      if (pNVar9 <= t->node) {
        pNVar19 = (Node *)0x0;
        break;
      }
      pNVar19 = pNVar9 + -1;
      t->lastfree = pNVar19;
      pNVar10 = pNVar9 + -1;
      pNVar9 = pNVar19;
    } while ((pNVar10->i_key).nk.tt_ != 0);
    if (pNVar19 == (Node *)0x0) {
      local_b8[0x1c] = 0;
      local_b8[0x1d] = 0;
      local_b8[0x1e] = 0;
      local_b8[0x18] = 0;
      local_b8[0x19] = 0;
      local_b8[0x1a] = 0;
      local_b8[0x1b] = 0;
      local_b8[0x14] = 0;
      local_b8[0x15] = 0;
      local_b8[0x16] = 0;
      local_b8[0x17] = 0;
      local_b8[0x10] = 0;
      local_b8[0x11] = 0;
      local_b8[0x12] = 0;
      local_b8[0x13] = 0;
      local_b8[0xc] = 0;
      local_b8[0xd] = 0;
      local_b8[0xe] = 0;
      local_b8[0xf] = 0;
      local_b8[8] = 0;
      local_b8[9] = 0;
      local_b8[10] = 0;
      local_b8[0xb] = 0;
      local_b8[4] = 0;
      local_b8[5] = 0;
      local_b8[6] = 0;
      local_b8[7] = 0;
      local_b8[0] = 0;
      local_b8[1] = 0;
      local_b8[2] = 0;
      local_b8[3] = 0;
      iVar12 = t->sizearray;
      lVar11 = 0;
      iVar6 = 1;
      iVar18 = 0;
      iVar20 = 1;
      do {
        iVar7 = iVar20;
        if ((iVar12 < iVar20) && (iVar7 = iVar12, iVar12 < iVar6)) {
          bVar4 = false;
        }
        else {
          iVar15 = 0;
          if (iVar6 <= iVar7) {
            lVar16 = (long)iVar6 + -1;
            piVar17 = &t->array[(long)iVar6 + -1].tt_;
            iVar15 = 0;
            do {
              iVar15 = (iVar15 + 1) - (uint)(*piVar17 == 0);
              lVar16 = lVar16 + 1;
              piVar17 = piVar17 + 4;
            } while (lVar16 < iVar7);
            iVar6 = iVar7 + 1;
          }
          local_b8[lVar11] = local_b8[lVar11] + iVar15;
          iVar18 = iVar18 + iVar15;
          bVar4 = true;
        }
        if (!bVar4) break;
        lVar11 = lVar11 + 1;
        iVar20 = iVar20 * 2;
      } while (lVar11 != 0x1f);
      lVar11 = (ulong)(uint)~(-1 << (t->lsizenode & 0x1f)) * 0x28 + 0x28;
      iVar20 = 0;
      iVar12 = 0;
      do {
        if (*(int *)((long)t->node + lVar11 + -0x20) != 0) {
          iVar6 = countint((TValue *)((long)t->node + lVar11 + -0x18),local_b8);
          iVar12 = iVar12 + iVar6;
          iVar20 = iVar20 + 1;
        }
        lVar11 = lVar11 + -0x28;
      } while (lVar11 != 0);
      piVar17 = local_b8;
      iVar6 = countint(key,piVar17);
      iVar7 = iVar6 + iVar12 + iVar18;
      if (iVar7 == 0 || SCARRY4(iVar6,iVar12 + iVar18) != iVar7 < 0) {
        iVar12 = 0;
        nasize = 0;
      }
      else {
        uVar14 = 0;
        nasize = 0;
        iVar12 = 0;
        iVar6 = 0;
        uVar13 = 1;
        do {
          iVar1 = *piVar17;
          iVar15 = iVar1 + iVar6;
          if (0 < iVar1) {
            iVar6 = iVar15;
          }
          if (0 < iVar1 && (int)uVar14 < iVar15) {
            nasize = uVar13;
            iVar12 = iVar15;
          }
          if (iVar6 == iVar7) break;
          uVar14 = uVar13 & 0x7fffffff;
          piVar17 = piVar17 + 1;
          uVar13 = uVar13 * 2;
        } while ((int)uVar14 < iVar7);
      }
      luaH_resize(L,t,nasize,((iVar18 + iVar20) - iVar12) + 1);
      pNVar9 = (Node *)luaH_set(L,t,key);
    }
    else {
      pNVar9 = mainposition(t,&(pNVar8->i_key).tvk);
      if (pNVar9 == pNVar8) {
        pNVar9 = (pNVar8->i_key).nk.next;
        (pNVar19->i_key).nk.next = pNVar9;
        (pNVar8->i_key).nk.next = pNVar19;
        pNVar8 = pNVar19;
      }
      else {
        do {
          pNVar10 = pNVar9;
          pNVar9 = (pNVar10->i_key).nk.next;
        } while (pNVar9 != pNVar8);
        (pNVar10->i_key).nk.next = pNVar19;
        pNVar9 = (pNVar8->i_key).nk.next;
        (pNVar19->i_key).nk.next = pNVar9;
        VVar2 = (pNVar8->i_val).value_;
        iVar12 = (pNVar8->i_val).tt_;
        uVar5 = *(undefined4 *)&(pNVar8->i_val).field_0xc;
        uVar3 = *(undefined8 *)((long)&pNVar8->i_key + 8);
        (pNVar19->i_key).nk.value_ = (pNVar8->i_key).nk.value_;
        *(undefined8 *)((long)&pNVar19->i_key + 8) = uVar3;
        (pNVar19->i_val).value_ = VVar2;
        (pNVar19->i_val).tt_ = iVar12;
        *(undefined4 *)&(pNVar19->i_val).field_0xc = uVar5;
        (pNVar8->i_key).nk.next = (Node *)0x0;
        (pNVar8->i_val).tt_ = 0;
      }
    }
    if (pNVar19 == (Node *)0x0) {
      return &pNVar9->i_val;
    }
  }
  (pNVar8->i_key).nk.value_ = key->value_;
  (pNVar8->i_key).nk.tt_ = key->tt_;
  if ((((key->tt_ & 0x40) != 0) && (((byte)(key->value_).f[9] & 3) != 0)) && ((t->marked & 4) != 0))
  {
    luaC_barrierback_(L,(GCObject *)t);
  }
  return &pNVar8->i_val;
}

Assistant:

TValue *luaH_newkey (lua_State *L, Table *t, const TValue *key) {
  Node *mp;
  if (ttisnil(key)) luaG_runerror(L, "table index is nil");
  else if (ttisnumber(key) && luai_numisnan(L, nvalue(key)))
    luaG_runerror(L, "table index is NaN");
  mp = mainposition(t, key);
  if (!ttisnil(gval(mp)) || isdummy(mp)) {  /* main position is taken? */
    Node *othern;
    Node *n = getfreepos(t);  /* get a free place */
    if (n == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' take care of TM cache and GC barrier */
      return luaH_set(L, t, key);  /* insert key into grown table */
    }
    lua_assert(!isdummy(n));
    othern = mainposition(t, gkey(mp));
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (gnext(othern) != mp) othern = gnext(othern);  /* find previous */
      gnext(othern) = n;  /* redo the chain with `n' in place of `mp' */
      *n = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      gnext(mp) = NULL;  /* now `mp' is free */
      setnilvalue(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      gnext(n) = gnext(mp);  /* chain new position */
      gnext(mp) = n;
      mp = n;
    }
  }
  setobj2t(L, gkey(mp), key);
  luaC_barrierback(L, obj2gco(t), key);
  lua_assert(ttisnil(gval(mp)));
  return gval(mp);
}